

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

int read_line_alloc(void *in,DataSourceType in_type,SXML_CHAR **line,int *sz_line,int i0,
                   SXML_CHAR from,SXML_CHAR to,int keep_fromto,SXML_CHAR interest,
                   int *interest_count)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  SXML_CHAR *pSVar7;
  code *pcVar8;
  char cVar9;
  code *pcVar10;
  size_t __size;
  ulong uVar11;
  uint local_60;
  
  pcVar8 = fgetc;
  if (in_type == DATA_SOURCE_BUFFER) {
    pcVar8 = _bgetc;
  }
  pcVar10 = feof;
  if (in_type == DATA_SOURCE_BUFFER) {
    pcVar10 = _beob;
  }
  if (line != (SXML_CHAR **)0x0 && in != (void *)0x0) {
    cVar9 = '\n';
    if (to != '\0') {
      cVar9 = to;
    }
    if (interest_count != (int *)0x0) {
      *interest_count = 0;
    }
    while( true ) {
      iVar2 = (*pcVar8)(in);
      cVar1 = (char)iVar2;
      if (iVar2 == -1) break;
      if ((interest_count != (int *)0x0) && (cVar1 == interest)) {
        *interest_count = *interest_count + 1;
      }
      if ((from == '\0') || (cVar1 == from)) break;
    }
    pSVar7 = *line;
    if (pSVar7 == (SXML_CHAR *)0x0) {
      if (sz_line == (int *)0x0) goto LAB_00105815;
      iVar3 = *sz_line;
      if (iVar3 == 0) goto LAB_001057f8;
LAB_00105808:
      __size = (size_t)iVar3;
      local_60 = 0;
LAB_00105822:
      pSVar7 = (SXML_CHAR *)malloc(__size);
      *line = pSVar7;
      if (pSVar7 == (SXML_CHAR *)0x0) goto LAB_0010599d;
      uVar11 = 0;
      if (0 < i0) {
        uVar11 = (ulong)(uint)i0;
      }
      uVar5 = local_60;
      if (sz_line != (int *)0x0) {
        uVar5 = *sz_line;
      }
    }
    else {
      if (sz_line == (int *)0x0) {
LAB_00105815:
        __size = 0x100;
        local_60 = 0x100;
        goto LAB_00105822;
      }
      if (*sz_line == 0) {
LAB_001057f8:
        *sz_line = 0x100;
        iVar3 = 0x100;
        goto LAB_00105808;
      }
      local_60 = 0;
      if (i0 < 1) {
        i0 = 0;
      }
      uVar11 = (ulong)(uint)i0;
      uVar5 = *sz_line;
    }
    if ((int)uVar11 < (int)uVar5) {
      if (iVar2 == -1) {
LAB_001059ba:
        pSVar7[uVar11 & 0xffffffff] = '\0';
        iVar2 = (*pcVar10)(in);
        uVar11 = uVar11 & 0xffffffff;
        if (iVar2 == 0) {
          uVar11 = 0;
        }
        goto LAB_001059a0;
      }
      if ((keep_fromto != 0) || (cVar1 != from)) {
        uVar5 = (int)uVar11 + 1;
        pSVar7[uVar11] = cVar1;
        uVar11 = (ulong)uVar5;
        if (sz_line == (int *)0x0) {
          if (local_60 <= uVar5) {
            uVar4 = local_60 + 0x100;
            local_60 = uVar4;
            goto LAB_001058c2;
          }
        }
        else if (*sz_line <= (int)uVar5) {
          uVar4 = *sz_line + 0x100;
          *sz_line = uVar4;
LAB_001058c2:
          pSVar7 = (SXML_CHAR *)realloc(*line,(long)(int)uVar4);
          if (pSVar7 == (SXML_CHAR *)0x0) goto LAB_0010599d;
          *line = pSVar7;
          uVar11 = (ulong)uVar5;
        }
      }
      (*line)[uVar11] = '\0';
      do {
        iVar2 = (*pcVar8)(in);
        if (iVar2 == -1) {
          pSVar7 = *line;
          goto LAB_001059ba;
        }
        cVar1 = (char)iVar2;
        if ((interest_count != (int *)0x0) && (cVar1 == interest)) {
          *interest_count = *interest_count + 1;
        }
        uVar6 = uVar11 & 0xffffffff;
        uVar11 = (cVar1 != cVar9 || keep_fromto != 0) + uVar6;
        (*line)[uVar6] = cVar1;
        if (sz_line == (int *)0x0) {
          if ((int)local_60 <= (int)uVar11) {
            uVar5 = local_60 + 0x100;
            local_60 = uVar5;
            goto LAB_0010596a;
          }
        }
        else if (*sz_line <= (int)uVar11) {
          uVar5 = *sz_line + 0x100;
          *sz_line = uVar5;
LAB_0010596a:
          pSVar7 = (SXML_CHAR *)realloc(*line,(long)(int)uVar5);
          if (pSVar7 == (SXML_CHAR *)0x0) goto LAB_0010599d;
          *line = pSVar7;
        }
        (*line)[uVar11] = '\0';
      } while (cVar1 != cVar9);
      goto LAB_001059a0;
    }
  }
LAB_0010599d:
  uVar11 = 0;
LAB_001059a0:
  return (int)uVar11;
}

Assistant:

int read_line_alloc(void* in, DataSourceType in_type, SXML_CHAR** line, int* sz_line, int i0, SXML_CHAR from, SXML_CHAR to, int keep_fromto, SXML_CHAR interest, int* interest_count)
{
	int init_sz = 0;
	SXML_CHAR ch, *pt;
	int c;
	int n, ret;
	int (*mgetc)(void* ds) = (in_type == DATA_SOURCE_BUFFER ? (int(*)(void*))_bgetc : (int(*)(void*))sx_fgetc);
	int (*meos)(void* ds) = (in_type == DATA_SOURCE_BUFFER ? (int(*)(void*))_beob : (int(*)(void*))sx_feof);
	
	if (in == NULL || line == NULL)
		return 0;
	
	if (to == NULC)
		to = C2SX('\n');
	/* Search for character 'from' */
	if (interest_count != NULL)
		*interest_count = 0;
	for (;;) {
		/* Reaching EOF before 'to' char is not an error but should trigger 'line' alloc and init to '' */
		c = mgetc(in);
		ch = (SXML_CHAR)c;
		if (c == EOF)
			break;
		if (interest_count != NULL && ch == interest)
			(*interest_count)++;
		/* If 'from' is '\0', we stop here */
		if (ch == from || from == NULC)
			break;
	}
	
	if (sz_line == NULL)
		sz_line = &init_sz;
	
	if (*line == NULL || *sz_line == 0) {
		if (*sz_line == 0)
			*sz_line = MEM_INCR_RLA;
		*line = __malloc(*sz_line*sizeof(SXML_CHAR));
		if (*line == NULL)
			return 0;
	}
	if (i0 < 0)
		i0 = 0;
	if (i0 >= *sz_line)
		return 0;
	
	n = i0;
	if (c == CEOF) { /* EOF reached before 'to' char => return the empty string */
		(*line)[n] = NULC;
		return meos(in) ? n : 0; /* Error if not EOF */
	}
	if (ch != from || keep_fromto) {
		(*line)[n++] = ch;
		if (n >= *sz_line) {
			*sz_line += MEM_INCR_RLA;
			pt = __realloc(*line, *sz_line*sizeof(SXML_CHAR));
			if (pt == NULL) {
				return 0;
			} else
				*line = pt;
		}
	}
	(*line)[n] = NULC;
	ret = 0;
	for (;;) {
		if ((c = mgetc(in)) == CEOF) { /* EOF or error */
			(*line)[n] = NULC;
			ret = meos(in) ? n : 0;
			break;
		}
		ch = (SXML_CHAR)c;
		if (interest_count != NULL && ch == interest)
			(*interest_count)++;
		(*line)[n] = ch;
		if (ch != to || (keep_fromto && to != NULC && ch == to)) /* If we reached the 'to' character and we keep it, we still need to add the extra '\0' */
			n++;
		if (n >= *sz_line) { /* Too many characters for our line => realloc some more */
			*sz_line += MEM_INCR_RLA;
			pt = __realloc(*line, *sz_line*sizeof(SXML_CHAR));
			if (pt == NULL) {
				ret = 0;
				break;
			} else
				*line = pt;
		}
		(*line)[n] = NULC; /* If we reached the 'to' character and we want to strip it, 'n' hasn't changed and 'line[n]' (which is 'to') will be replaced by '\0' */
		if (ch == to) {
			ret = n;
			break;
		}
	}
	
#if 0 /* Automatic buffer resize is deactivated */
	/* Resize line to the exact size */
	pt = __realloc(*line, (n+1)*sizeof(SXML_CHAR));
	if (pt != NULL)
		*line = pt;
#endif
	
	return ret;
}